

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::
TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
::add_sample(TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
             *this,double t,
            vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *v)

{
  undefined1 local_48 [8];
  Sample s;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *v_local;
  double t_local;
  TypedTimeSamples<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
  *this_local;
  
  s._32_8_ = v;
  Sample::Sample((Sample *)local_48);
  local_48 = (undefined1  [8])t;
  ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::operator=
            ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)&s,
             (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
             s._32_8_);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>::Sample>>
  ::
  emplace_back<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>::Sample>>
              *)this,(Sample *)local_48);
  this->_dirty = true;
  Sample::~Sample((Sample *)local_48);
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }